

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

Abc_SccCost_t Abc_TgRecordPhase(Abc_TgMan_t *pMan,int mode)

{
  Vec_Int_t *p;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  ulong uVar6;
  int *pIn1;
  int *pIn2;
  Abc_SccCost_t AVar7;
  int pMinScc [18];
  int pScc [18];
  
  if (pMan->fPhased == 0) {
    p = pMan->vPhase;
    iVar3 = (int)pMan->pGroup[0].nGVars;
    iVar2 = (pMan->nGVars - (uint)(mode == 0)) + 2;
    Abc_TgReorderFGrps(pMan);
    pMinScc[1] = Abc_TtScc(pMan->pTruth,pMan->nVars);
    Abc_TgCalcScc(pMan,pMinScc + 2,1);
    if (mode == 0) {
      pMinScc[0] = 0;
    }
    else {
      pMinScc[0] = Abc_TgPermCostScc(pMan,pMinScc + 2);
    }
    Vec_IntPush(p,0);
    pIn1 = pScc + (mode == 0);
    pIn2 = pMinScc + (mode == 0);
    uVar6 = 1;
    while( true ) {
      uVar1 = (uint)uVar6;
      iVar4 = grayFlip(uVar1 - 1);
      if (iVar3 <= iVar4) break;
      Abc_TgFlipSymGroupByVar(pMan,(int)pMan->pFGrps[iVar4]);
      pScc[1] = Abc_TtScc(pMan->pTruth,pMan->nVars);
      if ((mode != 0) || (pScc[1] <= pMinScc[1])) {
        Abc_TgCalcScc(pMan,pScc + 2,1);
        if (0 < mode) {
          pScc[0] = Abc_TgPermCostScc(pMan,pScc + 2);
        }
        iVar4 = Abc_TgCompareCoef(pIn1,pIn2,iVar2);
        if (iVar4 < 0) {
          memcpy(pIn2,pIn1,(long)iVar2 << 2);
          p->nSize = 0;
        }
        iVar4 = Abc_TgCompareCoef(pIn1,pIn2,iVar2);
        if (iVar4 == 0) {
          Vec_IntPush(p,(uint)(uVar6 >> 1) ^ uVar1);
        }
      }
      uVar6 = (ulong)(uVar1 + 1);
    }
    Abc_TgFlipSymGroupByVar(pMan,(int)pMan->pFGrps[(long)iVar3 + -1]);
    iVar4 = ilog2(p->nSize);
    iVar2 = Abc_TgPermCostScc(pMan,pMinScc + 2);
    uVar5 = CONCAT44(iVar4,iVar3);
  }
  else {
    Abc_TgCalcScc(pMan,pScc + 2,1);
    iVar2 = Abc_TgPermCostScc(pMan,pScc + 2);
    uVar5 = 0;
  }
  AVar7.cPerm = iVar2;
  AVar7.cNeg = (int)uVar5;
  AVar7.cPhase = (int)((ulong)uVar5 >> 0x20);
  return AVar7;
}

Assistant:

static Abc_SccCost_t Abc_TgRecordPhase(Abc_TgMan_t * pMan, int mode)
{
    Vec_Int_t * vPhase = pMan->vPhase;
    int i, j, n = pMan->pGroup->nGVars;
    int nStart = mode == 0 ? 1 : 0;
    int nCoefs = pMan->nGVars + 2 - nStart;
    int pScc[18], pMinScc[18];
    Abc_SccCost_t ret;

    if (pMan->fPhased)
    {
        ret.cNeg = 0;
        ret.cPhase = 0;
        Abc_TgCalcScc(pMan, pScc + 2, 1);
        ret.cPerm = Abc_TgPermCostScc(pMan, pScc + 2);
        return ret;
    }

    Abc_TgReorderFGrps(pMan);
    pMinScc[1] = Abc_TtScc(pMan->pTruth, pMan->nVars);
    Abc_TgCalcScc(pMan, pMinScc + 2, 1);
    pMinScc[0] = mode == 0 ? 0 : Abc_TgPermCostScc(pMan, pMinScc + 2);
    Vec_IntPush(vPhase, 0);
    for (i = 0; (j = grayFlip(i)) < n; i++)
    {
        Abc_TgFlipSymGroupByVar(pMan, pMan->pFGrps[j]);
        pScc[1] = Abc_TtScc(pMan->pTruth, pMan->nVars);
        if (mode == 0 && pScc[1] > pMinScc[1]) continue;
        Abc_TgCalcScc(pMan, pScc + 2, 1);
        if (mode > 0)
            pScc[0] = Abc_TgPermCostScc(pMan, pScc + 2);
        if (Abc_TgCompareCoef(pScc + nStart, pMinScc + nStart, nCoefs) < 0)
        {
            memcpy(pMinScc + nStart, pScc + nStart, nCoefs * sizeof(int));
            Vec_IntClear(vPhase);
        }
        if (Abc_TgCompareCoef(pScc + nStart, pMinScc + nStart, nCoefs) == 0)
            Vec_IntPush(vPhase, grayCode(i+1));
    }
    Abc_TgFlipSymGroupByVar(pMan, pMan->pFGrps[n - 1]);

    ret.cNeg = n;
    ret.cPhase = ilog2(Vec_IntSize(vPhase));
    ret.cPerm = Abc_TgPermCostScc(pMan, pMinScc + 2);
    return ret;
}